

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu511.c
# Opt level: O0

MPP_RET hal_h264e_vepu511_start(void *hal,HalEncTask *task)

{
  long lVar1;
  MPP_RET MVar2;
  long local_58;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  HalVepu511RegSet *regs;
  HalH264eVepu511Ctx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 400);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu511","enter %p\n","hal_h264e_vepu511_start",hal);
  }
  rd_cfg._8_8_ = lVar1;
  ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
  if (ctx._4_4_ == MPP_OK) {
    rd_cfg._8_8_ = lVar1 + 0x124;
    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
    if (ctx._4_4_ == MPP_OK) {
      rd_cfg._8_8_ = lVar1 + 0x3f0;
      ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
      if (ctx._4_4_ == MPP_OK) {
        rd_cfg._8_8_ = lVar1 + 0x554;
        ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
        if (ctx._4_4_ == MPP_OK) {
          rd_cfg._8_8_ = lVar1 + 0x820;
          ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
          if (ctx._4_4_ == MPP_OK) {
            rd_cfg._8_8_ = lVar1 + 0x98c;
            ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
            if (ctx._4_4_ == MPP_OK) {
              rd_cfg._8_8_ = lVar1 + 0xe1c;
              MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
              if (MVar2 != MPP_OK) {
                _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n",
                           "hal_h264e_vepu511_start",(ulong)(uint)MVar2);
                return MVar2;
              }
              ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),7,*(void **)((long)hal + 0x38));
              if (ctx._4_4_ == MPP_OK) {
                local_58 = lVar1 + 0x2c;
                rd_cfg.reg._0_4_ = 4;
                rd_cfg.reg._4_4_ = 0x2c;
                ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&local_58);
                if (ctx._4_4_ == MPP_OK) {
                  local_58 = lVar1 + 0x1084;
                  rd_cfg.reg._0_4_ = 0x250;
                  rd_cfg.reg._4_4_ = 0x4000;
                  ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&local_58);
                  if (ctx._4_4_ == MPP_OK) {
                    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
                    if (ctx._4_4_ != MPP_OK) {
                      _mpp_log_l(2,"hal_h264e_vepu511","send cmd failed %d\n",
                                 "hal_h264e_vepu511_start",(ulong)(uint)ctx._4_4_);
                    }
                  }
                  else {
                    _mpp_log_l(2,"hal_h264e_vepu511","set register read failed %d\n",
                               "hal_h264e_vepu511_start",(ulong)(uint)ctx._4_4_);
                  }
                }
                else {
                  _mpp_log_l(2,"hal_h264e_vepu511","set register read failed %d\n",
                             "hal_h264e_vepu511_start",(ulong)(uint)ctx._4_4_);
                }
              }
              else {
                _mpp_log_l(2,"hal_h264e_vepu511","set register offsets failed %d\n",
                           "hal_h264e_vepu511_start",(ulong)(uint)ctx._4_4_);
              }
            }
            else {
              _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n",
                         "hal_h264e_vepu511_start",(ulong)(uint)ctx._4_4_);
            }
          }
          else {
            _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n",
                       "hal_h264e_vepu511_start",(ulong)(uint)ctx._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n",
                     "hal_h264e_vepu511_start",(ulong)(uint)ctx._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n","hal_h264e_vepu511_start",
                   (ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n","hal_h264e_vepu511_start",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n","hal_h264e_vepu511_start",
               (ulong)(uint)ctx._4_4_);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu511","leave %p\n","hal_h264e_vepu511_start",hal);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu511_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu511Ctx *ctx = (HalH264eVepu511Ctx *)hal;
    HalVepu511RegSet *regs = ctx->regs_set;

    (void) task;

    hal_h264e_dbg_func("enter %p\n", hal);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &regs->reg_ctl;
        wr_cfg.size = sizeof(regs->reg_ctl);
        wr_cfg.offset = VEPU511_CTL_OFFSET;
#if DUMP_REG
        {
            RK_U32 i;
            RK_U32 *reg = (RK_U32)wr_cfg.reg;
            for ( i = 0; i < sizeof(regs->reg_ctl) / sizeof(RK_U32); i++) {
                mpp_log("reg[%d] = 0x%08x\n", i, reg[i]);
            }

        }
#endif
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_frm;
        wr_cfg.size = sizeof(regs->reg_frm);
        wr_cfg.offset = VEPU511_FRAME_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_rc_roi;
        wr_cfg.size = sizeof(regs->reg_rc_roi);
        wr_cfg.offset = VEPU511_RC_ROI_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_param;
        wr_cfg.size = sizeof(regs->reg_param);
        wr_cfg.offset = VEPU511_PARAM_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_sqi;
        wr_cfg.size = sizeof(regs->reg_sqi);
        wr_cfg.offset = VEPU511_SQI_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_scl;
        wr_cfg.size = sizeof(regs->reg_scl);
        wr_cfg.offset = VEPU511_SCL_OFFSET ;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_osd;
        wr_cfg.size = sizeof(regs->reg_osd);
        wr_cfg.offset = VEPU511_OSD_OFFSET ;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            return ret;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_OFFS, ctx->offsets);
        if (ret) {
            mpp_err_f("set register offsets failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->reg_ctl.int_sta;
        rd_cfg.size = sizeof(RK_U32);
        rd_cfg.offset = VEPU511_REG_BASE_HW_STATUS;
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->reg_st;
        rd_cfg.size = sizeof(regs->reg_st);
        rd_cfg.offset = VEPU511_STATUS_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* send request to hardware */
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}